

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O3

int lib_dlb_fseek(dlb *dp,long pos,int whence)

{
  if (whence == 2) {
    pos = dp->size - pos;
  }
  else if (whence == 1) {
    pos = pos + dp->mark;
  }
  if (pos < 1) {
    pos = 0;
  }
  if (dp->size <= pos) {
    pos = dp->size;
  }
  dp->mark = pos;
  return 0;
}

Assistant:

static int lib_dlb_fseek(dlb *dp, long pos, int whence)
{
    long curpos;

    switch (whence) {
	case SEEK_CUR:	   curpos = dp->mark + pos;	break;
	case SEEK_END:	   curpos = dp->size - pos;	break;
	default: /* set */ curpos = pos;		break;
    }
    if (curpos < 0) curpos = 0;
    if (curpos > dp->size) curpos = dp->size;

    dp->mark = curpos;
    return 0;
}